

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

RegistryHub ** Catch::anon_unknown_22::getTheRegistryHub(void)

{
  RegistryHub *this;
  
  if (getTheRegistryHub::theRegistryHub == (RegistryHub *)0x0) {
    this = (RegistryHub *)operator_new(0xd8);
    RegistryHub::RegistryHub(this);
    getTheRegistryHub::theRegistryHub = this;
  }
  return &getTheRegistryHub::theRegistryHub;
}

Assistant:

inline RegistryHub*& getTheRegistryHub() {
            static RegistryHub* theRegistryHub = NULL;
            if( !theRegistryHub )
                theRegistryHub = new RegistryHub();
            return theRegistryHub;
        }